

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O1

int __thiscall
CVmObject::get_prop_interface
          (CVmObject *this,vm_obj_id_t self,vm_prop_id_t prop,int *min_args,int *opt_args,
          int *varargs)

{
  int iVar1;
  uint uVar2;
  undefined6 in_register_00000012;
  CVmFuncPtr func;
  vm_val_t val;
  vm_obj_id_t source_obj;
  CVmFuncPtr local_40;
  vm_val_t local_38;
  undefined1 local_24 [4];
  
  *opt_args = 0;
  *min_args = 0;
  *varargs = 0;
  iVar1 = (*this->_vptr_CVmObject[0xd])
                    (this,CONCAT62(in_register_00000012,prop) & 0xffffffff,&local_38,self,local_24,0
                    );
  if (iVar1 == 0) {
    return 0;
  }
  if (1 < local_38.typ - VM_OBJX) {
    if (local_38.typ == VM_NATIVE_CODE) {
      *min_args = (local_38.val.native_desc)->min_argc_;
      *opt_args = (local_38.val.native_desc)->opt_argc_;
      uVar2 = (local_38.val.native_desc)->varargs_;
      goto LAB_002acc54;
    }
    if (local_38.typ != VM_CODEOFS) {
      return 1;
    }
  }
  local_40.p_ = (byte *)0x0;
  iVar1 = CVmFuncPtr::set(&local_40,&local_38);
  if (iVar1 == 0) {
    return 1;
  }
  *min_args = *local_40.p_ & 0x7f;
  *opt_args = (uint)local_40.p_[1];
  uVar2 = (uint)(*local_40.p_ >> 7);
LAB_002acc54:
  *varargs = uVar2;
  return 1;
}

Assistant:

int CVmObject::get_prop_interface(VMG_ vm_obj_id_t self, vm_prop_id_t prop,
                                  int &min_args, int &opt_args, int &varargs)
{
    vm_val_t val;
    vm_obj_id_t source_obj;

    /* presume we won't find an argument interface */
    min_args = opt_args = 0;
    varargs = FALSE;

    /* get the property value */
    if (!get_prop(vmg_ prop, &val, self, &source_obj, 0))
    {
        /* we didn't find the property at all */
        return FALSE;
    }
    else if (val.typ == VM_CODEOFS
             || val.typ == VM_OBJX
             || val.typ == VM_BIFPTRX)
    {
        /* 
         *   It's a direct pointer to static code, an object that we execute
         *   on evaluation, or a built-in function pointer.  Try getting a
         *   pointer to the method header.  CODEOFS and BIFPTRX values always
         *   have method headers; OBJX values do if the underlying object is
         *   invokable.  If the object *isn't* invokable, it won't have a
         *   method header; the only way this can happen is that we have a
         *   String object as an OBJX property, which acts like a DSTRING
         *   when evaluated.  That has the default zero-argument interface,
         *   so we can simply leave the return value with the defaults we've
         *   already set up in this case.  
         */
        CVmFuncPtr func;
        if (func.set(vmg_ &val))
        {
            /* it's an invokable - get the interface info from the header */
            min_args = func.get_min_argc();
            opt_args = func.get_opt_argc();
            varargs = func.is_varargs();
        }

        /* got it */
        return TRUE;
    }
    else if (val.typ == VM_NATIVE_CODE)
    {
        /* get the arguments from the native code descriptor */
        min_args = val.val.native_desc->min_argc_;
        opt_args = val.val.native_desc->opt_argc_;
        varargs = val.val.native_desc->varargs_;

        /* we found the property */
        return TRUE;
    }
    else
    {
        /* 
         *   it's not a function, so there are no arguments, but we did find
         *   the property 
         */
        return TRUE;
    }
}